

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)300>(Result *__return_storage_ptr__,Model *format)

{
  allocator<CoreML::Specification::FeatureType::TypeCase> *this;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  bool bVar1;
  int32 modelVersion;
  int iVar2;
  int iVar3;
  ModelDescription *description;
  FeatureDescription *pFVar4;
  GLMRegressor *from;
  GLMRegressor_DoubleArray *pGVar5;
  allocator local_1b9;
  string local_1b8;
  int local_194;
  int local_190;
  int i_2;
  int expected_size;
  undefined1 local_168 [8];
  GLMRegressor lr;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_108;
  Result local_f0;
  int local_c4;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_bd;
  int i_1;
  undefined4 local_b8;
  undefined4 local_b4;
  iterator local_b0;
  size_type local_a8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_a0;
  Result local_88;
  int local_5c;
  undefined4 local_58;
  int i;
  undefined1 local_48 [8];
  Result result;
  ModelDescription *interface;
  Model *format_local;
  
  description = Specification::Model::description(format);
  result.m_message.field_2._8_8_ = description;
  modelVersion = Specification::Model::specificationversion(format);
  validateRegressorInterface((Result *)local_48,description,modelVersion);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    for (local_5c = 0; iVar3 = local_5c,
        iVar2 = Specification::ModelDescription::input_size
                          ((ModelDescription *)result.m_message.field_2._8_8_), iVar3 < iVar2;
        local_5c = local_5c + 1) {
      i_1 = 2;
      local_b8 = 5;
      local_b4 = 1;
      local_b0 = (iterator)&i_1;
      local_a8 = 3;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_bd);
      __l_00._M_len = local_a8;
      __l_00._M_array = local_b0;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_a0,__l_00,&local_bd);
      pFVar4 = Specification::ModelDescription::input
                         ((ModelDescription *)result.m_message.field_2._8_8_,local_5c);
      validateSchemaTypes(&local_88,&local_a0,pFVar4);
      Result::operator=((Result *)local_48,&local_88);
      Result::~Result(&local_88);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_a0);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_bd);
      bVar1 = Result::good((Result *)local_48);
      if (!bVar1) {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
        local_58 = 1;
        goto LAB_00997388;
      }
    }
    for (local_c4 = 0; iVar3 = local_c4,
        iVar2 = Specification::ModelDescription::output_size
                          ((ModelDescription *)result.m_message.field_2._8_8_), iVar3 < iVar2;
        local_c4 = local_c4 + 1) {
      lr._68_4_ = 2;
      this = (allocator<CoreML::Specification::FeatureType::TypeCase> *)
             ((long)&lr._cached_size_ + 3);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(this);
      __l._M_len = 1;
      __l._M_array = (iterator)&lr.field_0x44;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_108,__l,this);
      pFVar4 = Specification::ModelDescription::output
                         ((ModelDescription *)result.m_message.field_2._8_8_,local_c4);
      validateSchemaTypes(&local_f0,&local_108,pFVar4);
      Result::operator=((Result *)local_48,&local_f0);
      Result::~Result(&local_f0);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_108);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
                ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
                 ((long)&lr._cached_size_ + 3));
      bVar1 = Result::good((Result *)local_48);
      if (!bVar1) {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
        local_58 = 1;
        goto LAB_00997388;
      }
    }
    from = Specification::Model::glmregressor(format);
    Specification::GLMRegressor::GLMRegressor((GLMRegressor *)local_168,from);
    iVar3 = Specification::GLMRegressor::weights_size((GLMRegressor *)local_168);
    iVar2 = Specification::GLMRegressor::offset_size((GLMRegressor *)local_168);
    if (iVar3 == iVar2) {
      iVar3 = Specification::GLMRegressor::weights_size((GLMRegressor *)local_168);
      if (0 < iVar3) {
        pGVar5 = Specification::GLMRegressor::weights((GLMRegressor *)local_168,0);
        local_190 = Specification::GLMRegressor_DoubleArray::value_size(pGVar5);
        for (local_194 = 1; iVar3 = local_194,
            iVar2 = Specification::GLMRegressor::weights_size((GLMRegressor *)local_168),
            iVar3 < iVar2; local_194 = local_194 + 1) {
          pGVar5 = Specification::GLMRegressor::weights((GLMRegressor *)local_168,local_194);
          iVar3 = Specification::GLMRegressor_DoubleArray::value_size(pGVar5);
          if (iVar3 != local_190) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1b8,"All weight coefficients must be the same size.",
                       &local_1b9);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1b8);
            std::__cxx11::string::~string((string *)&local_1b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
            goto LAB_0099736c;
          }
        }
      }
      Result::Result(__return_storage_ptr__);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&expected_size,"Weights and offsets must be the same size.",
                 (allocator *)((long)&i_2 + 3));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&expected_size);
      std::__cxx11::string::~string((string *)&expected_size);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 3));
    }
LAB_0099736c:
    local_58 = 1;
    Specification::GLMRegressor::~GLMRegressor((GLMRegressor *)local_168);
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_58 = 1;
  }
LAB_00997388:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmRegressor>(const Specification::Model& format) {
        const Specification::ModelDescription& interface = format.description();

        // Must have a regressor interface (since GLMRegressor is an MLRegressor)
        Result result = validateRegressorInterface(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Check allowed output input & types are supported by this model.
        for (int i = 0; i < interface.input_size(); i++) {
            result = validateSchemaTypes({
                            Specification::FeatureType::kDoubleType,
                            Specification::FeatureType::kMultiArrayType,
                            Specification::FeatureType::kInt64Type
                      }, interface.input(i));
            if (!result.good()) {
                return result;
            }
        }
        for (int i = 0; i < interface.output_size(); i++) {
            result = validateSchemaTypes({
                Specification::FeatureType::kDoubleType,
            }, interface.output(i));

            if (!result.good()) {
                return result;
            }
        }
        
        // Linear regression specific type checking.
        // -------------------------------------------------------------------------
        auto lr = format.glmregressor();
        if (lr.weights_size() != lr.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Weights and offsets must be the same size.");
        }
        
        if (lr.weights_size() > 0) {
            int expected_size = lr.weights(0).value_size();
            for (int i = 1; i < lr.weights_size(); i++) {
                if (lr.weights(i).value_size() != expected_size) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "All weight coefficients must be the same size.");
                }
            }
        }
        return Result();
    }